

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vrle.cpp
# Opt level: O1

void __thiscall VRle::Data::opGeneric(Data *this,Data *aObj,Data *bObj,Op op)

{
  short sVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  pointer pSVar6;
  pointer pSVar7;
  pointer pSVar8;
  Span *pSVar13;
  long lVar14;
  Span *pSVar15;
  pointer pSVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  Span *pSVar20;
  size_t sVar21;
  size_t sVar22;
  bool bVar23;
  Result result;
  rle_view local_870;
  pointer local_860;
  rle_view local_858;
  Op local_844;
  Span *local_840;
  long local_838;
  pointer local_830;
  Span local_828 [255];
  
  pSVar20 = (aObj->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_840 = (aObj->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_838 = (long)local_840 - (long)pSVar20;
  sVar21 = local_838 >> 3;
  local_870._data =
       (bObj->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_830 = (bObj->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
              super__Vector_impl_data._M_finish;
  lVar14 = (long)local_830 - (long)local_870._data;
  sVar22 = lVar14 >> 3;
  local_870._size = sVar22;
  local_860 = local_870._data;
  local_858._data = pSVar20;
  local_858._size = sVar21;
  local_844 = op;
  std::vector<VRle::Span,_std::allocator<VRle::Span>_>::reserve(&this->mSpans,sVar21 + sVar22);
  updateBbox(aObj);
  uVar2 = (aObj->mBbox).x1;
  uVar9 = (aObj->mBbox).y1;
  uVar3 = (aObj->mBbox).x2;
  uVar10 = (aObj->mBbox).y2;
  updateBbox(bObj);
  pSVar8 = local_860;
  uVar4 = (bObj->mBbox).x1;
  uVar11 = (bObj->mBbox).y1;
  uVar5 = (bObj->mBbox).x2;
  uVar12 = (bObj->mBbox).y2;
  if ((((int)uVar2 < (int)uVar5 && (int)uVar4 < (int)uVar3) && ((int)uVar11 < (int)uVar10)) &&
     ((int)uVar9 < (int)uVar12)) {
    bVar23 = pSVar20 == local_840;
    pSVar15 = pSVar20;
    if (!bVar23) {
      sVar1 = pSVar20->y;
      pSVar13 = pSVar20;
      while (pSVar15 = pSVar13, sVar1 < local_860->y) {
        pSVar15 = pSVar13 + 1;
        bVar23 = pSVar15 == local_840;
        if (bVar23) break;
        sVar1 = pSVar13[1].y;
        pSVar13 = pSVar15;
      }
    }
    lVar14 = (long)pSVar15 - (long)pSVar20;
    if (lVar14 != 0) {
      pSVar6 = (this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar19 = ((long)(this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)pSVar6 >> 3) + (lVar14 >> 3)
      ;
      if ((ulong)((long)(this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pSVar6 >> 3) <
          uVar19) {
        std::vector<VRle::Span,_std::allocator<VRle::Span>_>::reserve(&this->mSpans,uVar19);
      }
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<VRle::Span_const*,std::back_insert_iterator<std::vector<VRle::Span,std::allocator<VRle::Span>>>>
                (pSVar20,(Span *)(lVar14 + (long)pSVar20),
                 (back_insert_iterator<std::vector<VRle::Span,_std::allocator<VRle::Span>_>_>)this);
    }
    pSVar6 = local_830;
    pSVar16 = pSVar8;
    if (!(bool)(bVar23 | pSVar8 == local_830)) {
      do {
        if (pSVar15->y <= pSVar16->y) break;
        pSVar16 = pSVar16 + 1;
      } while (pSVar16 != local_830);
    }
    lVar14 = (long)pSVar16 - (long)pSVar8;
    if (lVar14 != 0) {
      pSVar7 = (this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar19 = ((long)(this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)pSVar7 >> 3) + (lVar14 >> 3)
      ;
      if ((ulong)((long)(this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pSVar7 >> 3) <
          uVar19) {
        std::vector<VRle::Span,_std::allocator<VRle::Span>_>::reserve(&this->mSpans,uVar19);
      }
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<VRle::Span_const*,std::back_insert_iterator<std::vector<VRle::Span,std::allocator<VRle::Span>>>>
                (pSVar8,(Span *)(lVar14 + (long)pSVar8),
                 (back_insert_iterator<std::vector<VRle::Span,_std::allocator<VRle::Span>_>_>)this);
    }
    local_858._size = (long)local_840 - (long)pSVar15 >> 3;
    local_870._size = (long)pSVar6 - (long)pSVar16 >> 3;
    lVar14 = 0;
    do {
      *(undefined4 *)((long)&local_828[0].y + lVar14 + 1) = 0;
      *(undefined4 *)((long)&local_828[0].x + lVar14) = 0;
      lVar14 = lVar14 + 8;
    } while (lVar14 != 0x7f8);
    bVar23 = local_858._size == 0;
    local_870._data = pSVar16;
    local_858._data = pSVar15;
    if ((!bVar23) && (local_870._size != 0)) {
      do {
        sVar21 = _opGeneric(&local_858,&local_870,(Result *)local_828,local_844);
        if (sVar21 != 0) {
          pSVar8 = (this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          uVar19 = ((long)(this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar8 >> 3) + sVar21;
          if ((ulong)((long)(this->mSpans).
                            super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage - (long)pSVar8 >> 3) < uVar19)
          {
            std::vector<VRle::Span,_std::allocator<VRle::Span>_>::reserve(&this->mSpans,uVar19);
          }
          std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<VRle::Span_const*,std::back_insert_iterator<std::vector<VRle::Span,std::allocator<VRle::Span>>>>
                    (local_828,local_828 + sVar21,
                     (back_insert_iterator<std::vector<VRle::Span,_std::allocator<VRle::Span>_>_>)
                     this);
        }
        bVar23 = local_858._size == 0;
      } while ((!bVar23) && (local_870._size != 0));
    }
    sVar22 = local_858._size;
    sVar21 = local_870._size;
    pSVar20 = local_870._data;
    if (local_870._size != 0) {
      pSVar8 = (this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar19 = ((long)(this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)pSVar8 >> 3) +
               local_870._size;
      if ((ulong)((long)(this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pSVar8 >> 3) <
          uVar19) {
        std::vector<VRle::Span,_std::allocator<VRle::Span>_>::reserve(&this->mSpans,uVar19);
      }
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<VRle::Span_const*,std::back_insert_iterator<std::vector<VRle::Span,std::allocator<VRle::Span>>>>
                (pSVar20,pSVar20 + sVar21,
                 (back_insert_iterator<std::vector<VRle::Span,_std::allocator<VRle::Span>_>_>)this);
    }
    pSVar20 = local_858._data;
    if (bVar23) goto LAB_0011176d;
    pSVar8 = (this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar19 = ((long)(this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)pSVar8 >> 3) + sVar22;
    if ((ulong)((long)(this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pSVar8 >> 3) <
        uVar19) {
      std::vector<VRle::Span,_std::allocator<VRle::Span>_>::reserve(&this->mSpans,uVar19);
    }
    pSVar15 = pSVar20 + sVar22;
  }
  else {
    pSVar6 = (this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar19 = (long)(this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pSVar6 >> 3;
    lVar17 = (long)(this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)pSVar6 >> 3;
    if (pSVar20->y < local_860->y) {
      uVar18 = lVar17 + sVar21;
      if (uVar19 < uVar18) {
        std::vector<VRle::Span,_std::allocator<VRle::Span>_>::reserve(&this->mSpans,uVar18);
      }
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<VRle::Span_const*,std::back_insert_iterator<std::vector<VRle::Span,std::allocator<VRle::Span>>>>
                (pSVar20,(Span *)((long)&pSVar20->x + local_838),
                 (back_insert_iterator<std::vector<VRle::Span,_std::allocator<VRle::Span>_>_>)this);
      pSVar6 = (this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar19 = ((long)(this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)pSVar6 >> 3) + sVar22;
      if ((ulong)((long)(this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pSVar6 >> 3) <
          uVar19) {
        std::vector<VRle::Span,_std::allocator<VRle::Span>_>::reserve(&this->mSpans,uVar19);
      }
      pSVar15 = (Span *)(lVar14 + (long)pSVar8);
      pSVar20 = pSVar8;
    }
    else {
      uVar18 = lVar17 + sVar22;
      if (uVar19 < uVar18) {
        std::vector<VRle::Span,_std::allocator<VRle::Span>_>::reserve(&this->mSpans,uVar18);
      }
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<VRle::Span_const*,std::back_insert_iterator<std::vector<VRle::Span,std::allocator<VRle::Span>>>>
                (pSVar8,(Span *)(lVar14 + (long)pSVar8),
                 (back_insert_iterator<std::vector<VRle::Span,_std::allocator<VRle::Span>_>_>)this);
      pSVar8 = (this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar19 = ((long)(this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)pSVar8 >> 3) + sVar21;
      if ((ulong)((long)(this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pSVar8 >> 3) <
          uVar19) {
        std::vector<VRle::Span,_std::allocator<VRle::Span>_>::reserve(&this->mSpans,uVar19);
      }
      pSVar15 = (Span *)((long)&pSVar20->x + local_838);
    }
  }
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<VRle::Span_const*,std::back_insert_iterator<std::vector<VRle::Span,std::allocator<VRle::Span>>>>
            (pSVar20,pSVar15,
             (back_insert_iterator<std::vector<VRle::Span,_std::allocator<VRle::Span>_>_>)this);
LAB_0011176d:
  this->mBboxDirty = true;
  return;
}

Assistant:

void VRle::Data::opGeneric(const VRle::Data &aObj, const VRle::Data &bObj,
                           Op op)
{
    // This routine assumes, obj1(span_y) < obj2(span_y).

    auto a = aObj.view();
    auto b = bObj.view();

    // reserve some space for the result vector.
    mSpans.reserve(a.size() + b.size());

    // if two rle are disjoint
    if (!aObj.bbox().intersects(bObj.bbox())) {
        if (a.data()[0].y < b.data()[0].y) {
            copy(a.data(), a.size(), mSpans);
            copy(b.data(), b.size(), mSpans);
        } else {
            copy(b.data(), b.size(), mSpans);
            copy(a.data(), a.size(), mSpans);
        }
    } else {
        auto aPtr = a.data();
        auto aEnd = a.data() + a.size();
        auto bPtr = b.data();
        auto bEnd = b.data() + b.size();

        // 1. forward a till it intersects with b
        while ((aPtr != aEnd) && (aPtr->y < bPtr->y)) aPtr++;

        auto count = aPtr - a.data();
        if (count) copy(a.data(), count, mSpans);

        // 2. forward b till it intersects with a
        if (aPtr != aEnd)
            while ((bPtr != bEnd) && (bPtr->y < aPtr->y)) bPtr++;

        count = bPtr - b.data();
        if (count) copy(b.data(), count, mSpans);

        // update a and b object
        a = {aPtr, size_t(aEnd - aPtr)};
        b = {bPtr, size_t(bEnd - bPtr)};

        // 3. calculate the intersect region
        Result result;

        // run till all the spans are processed
        while (a.size() && b.size()) {
            auto count = _opGeneric(a, b, result, op);
            if (count) copy(result.data(), count, mSpans);
        }
        // 3. copy the rest
        if (b.size()) copy(b.data(), b.size(), mSpans);
        if (a.size()) copy(a.data(), a.size(), mSpans);
    }

    mBboxDirty = true;
}